

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O2

void __thiscall hierarchy_info::resize(hierarchy_info *this,kmp_uint32 nproc)

{
  kmp_uint32 *pkVar1;
  kmp_uint32 *pkVar2;
  kmp_uint32 *ptr;
  kmp_uint32 *pkVar3;
  uint uVar4;
  uint uVar5;
  kmp_uint32 kVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  kmp_uint32 i_2;
  ulong uVar10;
  bool bVar11;
  
  LOCK();
  bVar11 = this->resizing == '\0';
  if (bVar11) {
    this->resizing = '\x01';
  }
  UNLOCK();
  while( true ) {
    if (bVar11) {
      if (this->base_num_threads < nproc) {
        pkVar2 = this->skipPerLevel;
        uVar10 = (ulong)this->maxLevels;
        uVar7 = (ulong)this->depth;
        ptr = this->numPerLevel;
        uVar8 = uVar10;
        uVar9 = uVar7;
        for (uVar4 = pkVar2[this->depth - 1]; (uVar9 < uVar8 && (uVar4 < nproc)); uVar4 = uVar4 * 2)
        {
          uVar5 = (int)uVar9 - 1;
          pkVar2[uVar9] = pkVar2[uVar5] * 2;
          ptr[uVar5] = ptr[uVar5] << 1;
          uVar8 = (ulong)this->maxLevels;
          uVar5 = this->depth + 1;
          uVar7 = (ulong)uVar5;
          this->depth = uVar5;
          uVar9 = uVar9 + 1;
        }
        if (uVar4 < nproc) {
          kVar6 = (kmp_uint32)uVar7;
          uVar5 = (int)uVar8 * 2;
          while( true ) {
            kVar6 = kVar6 + 1;
            if (nproc <= uVar4) break;
            uVar4 = uVar4 * 2;
            this->depth = kVar6;
            uVar5 = uVar5 + 2;
            uVar8 = (ulong)((kmp_uint32)uVar8 + 1);
          }
          this->maxLevels = (kmp_uint32)uVar8;
          this->numPerLevel = (kmp_uint32 *)0x0;
          this->skipPerLevel = (kmp_uint32 *)0x0;
          pkVar3 = (kmp_uint32 *)___kmp_allocate((ulong)uVar5 << 2);
          this->numPerLevel = pkVar3;
          pkVar1 = pkVar3 + this->maxLevels;
          this->skipPerLevel = pkVar1;
          for (uVar8 = 0; uVar9 = uVar10, uVar10 != uVar8; uVar8 = uVar8 + 1) {
            pkVar3[uVar8] = ptr[uVar8];
            pkVar1[uVar8] = pkVar2[uVar8];
          }
          for (; uVar9 < this->maxLevels; uVar9 = uVar9 + 1) {
            pkVar3[uVar9] = 1;
            pkVar1[uVar9] = 1;
          }
          ___kmp_free(ptr);
        }
        pkVar2 = this->skipPerLevel;
        for (; uVar10 < this->maxLevels; uVar10 = uVar10 + 1) {
          pkVar2[uVar10] = pkVar2[(int)uVar10 - 1] * 2;
        }
        this->base_num_threads = nproc;
        this->resizing = '\0';
      }
      return;
    }
    if (nproc <= this->base_num_threads) break;
    LOCK();
    bVar11 = this->resizing == '\0';
    if (bVar11) {
      this->resizing = '\x01';
    }
    UNLOCK();
  }
  return;
}

Assistant:

void resize(kmp_uint32 nproc) {
    kmp_int8 bool_result = KMP_COMPARE_AND_STORE_ACQ8(&resizing, 0, 1);
    while (bool_result == 0) { // someone else is trying to resize
      KMP_CPU_PAUSE();
      if (nproc <= base_num_threads) // happy with other thread's resize
        return;
      else // try to resize
        bool_result = KMP_COMPARE_AND_STORE_ACQ8(&resizing, 0, 1);
    }
    KMP_DEBUG_ASSERT(bool_result != 0);
    if (nproc <= base_num_threads)
      return; // happy with other thread's resize

    // Calculate new maxLevels
    kmp_uint32 old_sz = skipPerLevel[depth - 1];
    kmp_uint32 incs = 0, old_maxLevels = maxLevels;
    // First see if old maxLevels is enough to contain new size
    for (kmp_uint32 i = depth; i < maxLevels && nproc > old_sz; ++i) {
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];
      numPerLevel[i - 1] *= 2;
      old_sz *= 2;
      depth++;
    }
    if (nproc > old_sz) { // Not enough space, need to expand hierarchy
      while (nproc > old_sz) {
        old_sz *= 2;
        incs++;
        depth++;
      }
      maxLevels += incs;

      // Resize arrays
      kmp_uint32 *old_numPerLevel = numPerLevel;
      kmp_uint32 *old_skipPerLevel = skipPerLevel;
      numPerLevel = skipPerLevel = NULL;
      numPerLevel =
          (kmp_uint32 *)__kmp_allocate(maxLevels * 2 * sizeof(kmp_uint32));
      skipPerLevel = &(numPerLevel[maxLevels]);

      // Copy old elements from old arrays
      for (kmp_uint32 i = 0; i < old_maxLevels;
           ++i) { // init numPerLevel[*] to 1 item per level
        numPerLevel[i] = old_numPerLevel[i];
        skipPerLevel[i] = old_skipPerLevel[i];
      }

      // Init new elements in arrays to 1
      for (kmp_uint32 i = old_maxLevels; i < maxLevels;
           ++i) { // init numPerLevel[*] to 1 item per level
        numPerLevel[i] = 1;
        skipPerLevel[i] = 1;
      }

      // Free old arrays
      __kmp_free(old_numPerLevel);
    }

    // Fill in oversubscription levels of hierarchy
    for (kmp_uint32 i = old_maxLevels; i < maxLevels; ++i)
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];

    base_num_threads = nproc;
    resizing = 0; // One writer
  }